

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_vsh_solid(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; uniform highp mat4 m; void main() { gl_Position = m * vec4(aV, 0, 1); }"
  ;
}

Assistant:

inline const char *openglrenderer_vsh_solid() { return RENGINE_GLSL(
   attribute highp vec2 aV;
   uniform highp mat4 m;
   void main() {
       gl_Position = m * vec4(aV, 0, 1);
   }
); }